

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmTarget.cxx
# Opt level: O3

cmSourceFile * __thiscall cmTarget::AddSourceCMP0049(cmTarget *this,string *s)

{
  cmSourceFile *pcVar1;
  string src;
  string local_30;
  
  ProcessSourceItemCMP0049(&local_30,this,s);
  if ((s->_M_string_length == 0) || (local_30._M_string_length != 0)) {
    pcVar1 = AddSource(this,&local_30);
  }
  else {
    pcVar1 = (cmSourceFile *)0x0;
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_30._M_dataplus._M_p != &local_30.field_2) {
    operator_delete(local_30._M_dataplus._M_p,local_30.field_2._M_allocated_capacity + 1);
  }
  return pcVar1;
}

Assistant:

cmSourceFile* cmTarget::AddSourceCMP0049(const std::string& s)
{
  std::string src = this->ProcessSourceItemCMP0049(s);
  if (!s.empty() && src.empty()) {
    return CM_NULLPTR;
  }
  return this->AddSource(src);
}